

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O3

int16 * ps_endpointer_process(ps_endpointer_t *ep,int16 *frame)

{
  uint uVar1;
  int iVar2;
  ps_vad_class_t pVar3;
  uint uVar4;
  int16 *piVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ps_vad_t *vad;
  long lVar9;
  double dVar10;
  
  if ((ep != (ps_endpointer_t *)0x0) && (vad = ep->vad, vad != (ps_vad_t *)0x0)) {
    if ((ep->in_speech != 0) && (ep->n == ep->maxlen)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
              ,0x126,"VAD queue overflow (should not happen)");
      vad = ep->vad;
    }
    pVar3 = ps_vad_classify(vad,frame);
    lVar9 = (long)((ep->n + ep->pos) % ep->maxlen);
    memcpy(ep->buf + ep->frame_size * lVar9,frame,(long)ep->frame_size * 2);
    ep->is_speech[lVar9] = (int8)pVar3;
    uVar1 = ep->maxlen;
    if (ep->n == uVar1) {
      dVar10 = ep->frame_length;
      ep->qstart_time = ep->qstart_time + dVar10;
      ep->pos = (ep->pos + 1) % (int)uVar1;
      uVar4 = uVar1;
    }
    else {
      uVar4 = ep->n + 1;
      ep->n = uVar4;
      dVar10 = ep->frame_length;
    }
    ep->timestamp = dVar10 + ep->timestamp;
    iVar8 = 0;
    if (uVar4 != 0) {
      if (uVar4 == uVar1) {
        iVar8 = 0;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          iVar8 = 0;
          do {
            iVar8 = iVar8 + ep->is_speech[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
      }
      else {
        iVar2 = ep->pos;
        iVar8 = (int)ep->is_speech[iVar2];
        for (iVar7 = iVar2 + 1; iVar7 != (int)(uVar4 + iVar2) % (int)uVar1;
            iVar7 = (iVar7 + 1) % (int)uVar1) {
          iVar8 = iVar8 + ep->is_speech[iVar7];
        }
      }
    }
    if (ep->in_speech == 0) {
      if (iVar8 <= ep->start_frames) {
        return (int16 *)0x0;
      }
      ep->speech_start = ep->qstart_time;
      ep->speech_end = 0.0;
      ep->in_speech = 1;
    }
    else if (iVar8 < ep->end_frames) {
      piVar5 = ep_pop(ep,(int *)0x0);
      ep->speech_end = ep->qstart_time;
      ep->in_speech = 0;
      return piVar5;
    }
    piVar5 = ep_pop(ep,(int *)0x0);
    return piVar5;
  }
  return (int16 *)0x0;
}

Assistant:

const int16 *
ps_endpointer_process(ps_endpointer_t *ep,
                      const int16 *frame)
{
    int is_speech, speech_count;
    if (ep == NULL || ep->vad == NULL)
        return NULL;
    if (ep->in_speech && ep_full(ep)) {
        E_ERROR("VAD queue overflow (should not happen)");
        /* Not fatal, we just lose data. */
    }
    is_speech = ps_vad_classify(ep->vad, frame);
    ep_push(ep, is_speech, frame);
    ep->timestamp += ep->frame_length;
    speech_count = ep_speech_count(ep);
    E_DEBUG("%.2f %d %d %d\n", ep->timestamp, speech_count,
            ep->start_frames, ep->end_frames);
    if (ep->in_speech) {
        if (speech_count < ep->end_frames) {
            /* Return only the first frame.  Either way it's sort of
               arbitrary, but this avoids having to drain the queue to
               prevent overlapping segments.  It's also closer to what
               human annotators will do. */
            int16 *pcm = ep_pop(ep, NULL);
            ep->speech_end = ep->qstart_time;
            ep->in_speech = FALSE;
            return pcm;
        }
    }
    else {
        if (speech_count > ep->start_frames) {
            ep->speech_start = ep->qstart_time;
            ep->speech_end = 0;
            ep->in_speech = TRUE;
        }
    }
    if (ep->in_speech)
        return ep_pop(ep, NULL);
    else
        return NULL;
}